

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdunzip.c
# Opt level: O3

int extract2fd(archive *a,char *pathname,int fd)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  size_t sVar5;
  ssize_t sVar6;
  size_t sVar7;
  char *__s;
  void *__dest;
  int *piVar8;
  long lVar9;
  bool bVar10;
  uint uVar11;
  ulong uVar12;
  uchar *puVar13;
  char *__s_00;
  byte *pbVar14;
  byte *pbVar15;
  uint local_4c;
  
  local_4c = (uint)a_opt;
  bVar2 = false;
  uVar12 = 0;
  bVar3 = 0;
  do {
    if ((((uVar12 & 3) == 0 && fd != 1) & tty) == 1) {
      info(" %c\b\b",(ulong)(uint)(int)"|/-\\"[(uint)(uVar12 >> 2) & 3]);
    }
    sVar5 = archive_read_data(a,buffer,0x2000);
    if ((int)sVar5 != 0 && (long)sVar5 < 0) {
      __s = archive_error_string(a);
      __s_00 = "%s";
      errorx("%s");
      if (__s_00 == (char *)0x0) {
        sVar5 = 0;
      }
      else {
        sVar5 = strlen(__s_00);
        sVar5 = sVar5 + 1;
      }
      sVar7 = strlen(__s);
      __dest = malloc(sVar7 + sVar5 + 1);
      if (__dest == (void *)0x0) {
        piVar8 = __errno_location();
        *piVar8 = 0xc;
        error("malloc()");
      }
      if (__s_00 != (char *)0x0) {
        memcpy(__dest,__s_00,sVar5);
        *(undefined1 *)((long)__dest + (sVar5 - 1)) = 0x2f;
      }
      memcpy((void *)((long)__dest + sVar5),__s,sVar7 + 1);
      return (int)__dest;
    }
    if ((bVar3 & a_opt) == 1) {
      if ((sVar5 == 0) || (buffer[0] != '\n')) {
        sVar6 = write(fd,"\r",1);
        bVar3 = 0;
        if (sVar6 == 1) goto LAB_001051ff;
LAB_00105380:
        error("write(\'%s\')",pathname);
      }
      bVar3 = 0;
      bVar4 = 1;
    }
    else {
LAB_001051ff:
      bVar4 = a_opt;
      if (sVar5 == 0) {
        return local_4c;
      }
    }
    if (((int)uVar12 == 0 & bVar4) == 1) {
      bVar10 = false;
      puVar13 = buffer;
      sVar7 = sVar5;
      do {
        lVar9 = 1 - sVar7;
        pbVar14 = puVar13;
        while( true ) {
          puVar13 = pbVar14 + 1;
          bVar1 = *pbVar14;
          if (0x1f < bVar1) break;
          uVar11 = 0;
          if ((0xf3ffc07fU >> (bVar1 & 0x1f) & 1) != 0) goto LAB_00105334;
          if ((1 << (bVar1 & 0x1f) & 0x2600U) != 0) break;
          lVar9 = lVar9 + 1;
          pbVar14 = puVar13;
          if (lVar9 == 1) {
            if (!bVar10) goto LAB_00105334;
            goto LAB_0010527e;
          }
        }
        sVar7 = -lVar9;
        bVar10 = true;
      } while (lVar9 != 0);
    }
LAB_0010527e:
    uVar11 = local_4c;
    if ((bVar4 & local_4c != 0) == 1) {
      if (0 < (long)sVar5) {
        puVar13 = buffer;
        pbVar15 = buffer + sVar5;
        pbVar14 = buffer;
LAB_001052a7:
        do {
          bVar10 = true;
          if (bVar2) {
LAB_001052ca:
            bVar2 = bVar10;
            if (*pbVar14 != 0xd) goto LAB_001052e0;
            if (pbVar14 + 1 == pbVar15) {
              bVar3 = 1;
            }
            else if (pbVar14[1] != 10) goto LAB_001052e0;
          }
          else {
            bVar2 = false;
            if (*pbVar14 < 0x20) {
              bVar10 = false;
              if ((0xf3ffc07fU >> (*pbVar14 & 0x1f) & 1) != 0) {
                warningx("%s may be corrupted due to weak text file detection heuristic",pathname);
                bVar10 = true;
              }
              goto LAB_001052ca;
            }
LAB_001052e0:
            pbVar14 = pbVar14 + 1;
            if (pbVar14 < pbVar15) goto LAB_001052a7;
          }
          sVar5 = write(fd,puVar13,(long)pbVar14 - (long)puVar13);
          if (sVar5 != (long)pbVar14 - (long)puVar13) goto LAB_00105380;
          puVar13 = pbVar14 + 1;
          pbVar14 = puVar13;
        } while (puVar13 < pbVar15);
      }
    }
    else {
LAB_00105334:
      sVar7 = write(fd,buffer,sVar5);
      local_4c = uVar11;
      if (sVar7 != sVar5) goto LAB_00105380;
    }
    uVar12 = (ulong)((int)uVar12 + 1);
  } while( true );
}

Assistant:

static int
extract2fd(struct archive *a, char *pathname, int fd)
{
	int cr, text, warn;
	ssize_t len;
	unsigned char *p, *q, *end;

	text = a_opt;
	warn = 0;
	cr = 0;

	/* loop over file contents and write to fd */
	for (int n = 0; ; n++) {
		if (fd != STDOUT_FILENO)
			if (tty && (n % 4) == 0)
				info(" %c\b\b", spinner[(n / 4) % sizeof spinner]);

		len = archive_read_data(a, buffer, sizeof buffer);

		if (len < 0)
			ac(len);

		/* left over CR from previous buffer */
		if (a_opt && cr) {
			if (len == 0 || buffer[0] != '\n')
				if (write(fd, "\r", 1) != 1)
					error("write('%s')", pathname);
			cr = 0;
		}

		/* EOF */
		if (len == 0)
			break;
		end = buffer + len;

		/*
		 * Detect whether this is a text file.  The correct way to
		 * do this is to check the least significant bit of the
		 * "internal file attributes" field of the corresponding
		 * file header in the central directory, but libarchive
		 * does not provide access to this field, so we have to
		 * guess by looking for non-ASCII characters in the
		 * buffer.  Hopefully we won't guess wrong.  If we do
		 * guess wrong, we print a warning message later.
		 */
		if (a_opt && n == 0) {
			if (check_binary(buffer, len))
				text = 0;
		}

		/* simple case */
		if (!a_opt || !text) {
			if (write(fd, buffer, len) != len)
				error("write('%s')", pathname);
			continue;
		}

		/* hard case: convert \r\n to \n (sigh...) */
		for (p = buffer; p < end; p = q + 1) {
			for (q = p; q < end; q++) {
				if (!warn && BYTE_IS_BINARY(*q)) {
					warningx("%s may be corrupted due"
					    " to weak text file detection"
					    " heuristic", pathname);
					warn = 1;
				}
				if (q[0] != '\r')
					continue;
				if (&q[1] == end) {
					cr = 1;
					break;
				}
				if (q[1] == '\n')
					break;
			}
			if (write(fd, p, q - p) != q - p)
				error("write('%s')", pathname);
		}
	}

	return text;
}